

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t helper_fmovemx_st_postinc_m68k(CPUM68KState_conflict *env,uint32_t addr,uint32_t mask)

{
  uint32_t uVar1;
  
  uVar1 = fmovem_postinc(env,addr,mask,cpu_st_floatx80_ra);
  return uVar1;
}

Assistant:

uint32_t HELPER(fmovemx_st_postinc)(CPUM68KState *env, uint32_t addr,
                                    uint32_t mask)
{
    return fmovem_postinc(env, addr, mask, cpu_st_floatx80_ra);
}